

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isDerivedFrom(Type *this,Type *base)

{
  bool bVar1;
  Type *pTVar2;
  Type *b;
  Type *d;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 uVar3;
  Type *local_20;
  bool local_1;
  
  local_20 = getCanonicalType((Type *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0))
  ;
  pTVar2 = getCanonicalType((Type *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  bVar1 = isClass((Type *)0xa0f526);
  if (bVar1) {
    do {
      uVar3 = false;
      if (local_20 != (Type *)0x0) {
        uVar3 = isClass((Type *)0xa0f54b);
      }
      if ((bool)uVar3 == false) {
        if ((local_20 != (Type *)0x0) && (bVar1 = isError((Type *)0xa0f597), bVar1)) {
          return true;
        }
        return false;
      }
      Symbol::as<slang::ast::ClassType>((Symbol *)0xa0f563);
      local_20 = ClassType::getBaseClass((ClassType *)CONCAT17(uVar3,in_stack_ffffffffffffffd0));
    } while (local_20 != pTVar2);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Type::isDerivedFrom(const Type& base) const {
    const Type* d = &getCanonicalType();
    const Type* b = &base.getCanonicalType();
    if (!b->isClass())
        return false;

    while (d && d->isClass()) {
        d = d->as<ClassType>().getBaseClass();
        if (d == b)
            return true;
    }

    // Allow error types to be convertible / derivable from anything else,
    // to prevent knock-on errors from being reported.
    if (d && d->isError())
        return true;

    return false;
}